

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BufferOffsetLengthCase::testBuffer
          (BufferOffsetLengthCase *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  uint uVar2;
  BufferParamVerifier *pBVar3;
  int ndx;
  long lVar4;
  
  pBVar3 = (this->super_BufferCase).m_verifier;
  lVar4 = 0;
  (*pBVar3->_vptr_BufferParamVerifier[2])
            (pBVar3,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9121,0
            );
  pBVar3 = (this->super_BufferCase).m_verifier;
  (*pBVar3->_vptr_BufferParamVerifier[2])
            (pBVar3,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9120,0
            );
  this_00 = &(this->super_BufferCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glBufferData
            (this_00,(this->super_BufferCase).m_bufferTarget,0x10,(void *)0x0,0x88ea);
  do {
    uVar1 = (&DAT_01c0da00)[lVar4 * 2];
    uVar2 = (&DAT_01c0da04)[lVar4 * 2];
    glu::CallLogWrapper::glMapBufferRange
              (this_00,(this->super_BufferCase).m_bufferTarget,(long)(int)uVar1,(long)(int)uVar2,2);
    ApiCase::expectError((ApiCase *)this,0);
    pBVar3 = (this->super_BufferCase).m_verifier;
    (*pBVar3->_vptr_BufferParamVerifier[2])
              (pBVar3,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9121
               ,(ulong)uVar1);
    pBVar3 = (this->super_BufferCase).m_verifier;
    (*pBVar3->_vptr_BufferParamVerifier[2])
              (pBVar3,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x9120
               ,(ulong)uVar2);
    ApiCase::expectError((ApiCase *)this,0);
    glu::CallLogWrapper::glUnmapBuffer(this_00,(this->super_BufferCase).m_bufferTarget);
    ApiCase::expectError((ApiCase *)this,0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void testBuffer (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_OFFSET, 0);
		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_LENGTH, 0);

		glBufferData(m_bufferTarget, 16, DE_NULL, GL_DYNAMIC_COPY);

		const struct BufferRange
		{
			int offset;
			int length;
		} ranges[] =
		{
			{ 0, 16 },
			{ 4, 12 },
			{ 0, 12 },
			{ 8,  8 },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ranges); ++ndx)
		{
			glMapBufferRange(m_bufferTarget, ranges[ndx].offset, ranges[ndx].length, GL_MAP_WRITE_BIT);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_OFFSET, ranges[ndx].offset);
			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAP_LENGTH, ranges[ndx].length);
			expectError(GL_NO_ERROR);

			glUnmapBuffer(m_bufferTarget);
			expectError(GL_NO_ERROR);
		}
	}